

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_value.c
# Opt level: O2

gravity_range_t * gravity_range_deserialize(gravity_vm *vm,json_value *json)

{
  uint uVar1;
  char *pcVar2;
  char *__s;
  long lVar3;
  int iVar4;
  size_t n;
  gravity_range_t *pgVar5;
  uint32_t i;
  ulong uVar6;
  long lVar7;
  gravity_int_t local_50;
  gravity_int_t local_48;
  
  uVar1 = (json->u).string.length;
  uVar6 = 1;
  lVar7 = 0x28;
  local_50 = 0;
  local_48 = 0;
  do {
    if (uVar1 <= uVar6) {
      pgVar5 = gravity_range_new(vm,local_48,local_50,true);
      return pgVar5;
    }
    pcVar2 = (json->u).string.ptr;
    __s = *(char **)(pcVar2 + lVar7 + -0x10);
    lVar3 = *(long *)(pcVar2 + lVar7);
    n = strlen(__s);
    iVar4 = string_casencmp(__s,"from",n);
    if (iVar4 == 0) {
      if (*(int *)(lVar3 + 8) != 3) {
        return (gravity_range_t *)0x0;
      }
      local_48 = *(gravity_int_t *)(lVar3 + 0x10);
    }
    else {
      iVar4 = string_casencmp(__s,"to",n);
      if (iVar4 == 0) {
        if (*(int *)(lVar3 + 8) != 3) {
          return (gravity_range_t *)0x0;
        }
        local_50 = *(gravity_int_t *)(lVar3 + 0x10);
      }
    }
    uVar6 = uVar6 + 1;
    lVar7 = lVar7 + 0x18;
  } while( true );
}

Assistant:

gravity_range_t *gravity_range_deserialize (gravity_vm *vm, json_value *json) {
    json_int_t from = 0;
    json_int_t to = 0;
    
    uint32_t n = json->u.object.length;
    for (uint32_t i=1; i<n; ++i) { // from 1 to skip type
        const char *label = json->u.object.values[i].name;
        json_value *value = json->u.object.values[i].value;
        size_t label_size = strlen(label);
        
        // from
        if (string_casencmp(label, GRAVITY_JSON_LABELFROM, label_size) == 0) {
            if (value->type != json_integer) goto abort_load;
            from = value->u.integer;
            continue;
        }
        
        // to
        if (string_casencmp(label, GRAVITY_JSON_LABELTO, label_size) == 0) {
            if (value->type != json_integer) goto abort_load;
            to = value->u.integer;
            continue;
        }
    }
    
    return gravity_range_new(vm, (gravity_int_t)from, (gravity_int_t)to, true);
    
abort_load:
    return NULL;
}